

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_expression_statement
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<xscript::tokenizer::token_t> __l;
  bool bVar1;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  undefined8 local_d8;
  allocator<char> local_c9;
  string local_c8;
  allocator<xscript::tokenizer::token_t> local_a6;
  less<xscript::tokenizer::token_t> local_a5;
  anon_enum_32 local_a4;
  iterator local_a0;
  size_type local_98;
  set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_90;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,EXPRESSION_STATEMENT);
  bVar1 = parse_expression(this,local_28);
  if (bVar1) {
    bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_SEMICOLON);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_c9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_f0,"\';\' expected after expression statement");
      local_d8 = 1;
      args._M_len = 1;
      args._M_array = &local_f0;
      local_e0 = &local_f0;
      this_local._7_1_ = append_syntax_error(this,&local_c8,0x522,args);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    else {
      next(this);
      this_local._7_1_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_49);
    local_a4 = TK_SEMICOLON;
    local_a0 = &local_a4;
    local_98 = 1;
    std::allocator<xscript::tokenizer::token_t>::allocator(&local_a6);
    __l._M_len = local_98;
    __l._M_array = local_a0;
    std::
    set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
    ::set(&local_90,__l,&local_a5,&local_a6);
    this_local._7_1_ = process_failover(this,&local_48,0x51e,&local_90,true);
    std::
    set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
    ::~set(&local_90);
    std::allocator<xscript::tokenizer::token_t>::~allocator(&local_a6);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_expression_statement(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(EXPRESSION_STATEMENT);

    if (!parse_expression(node)) {
        return failover({tokenizer::TK_SEMICOLON});
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after expression statement"});
    }
    next();

    return true;
}